

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp9d_com.c
# Opt level: O3

void hal_vp9d_update_counts(void *buf,void *dxva)

{
  int iVar1;
  byte bVar2;
  bool bVar3;
  long lVar4;
  ushort uVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  long lVar9;
  int *piVar10;
  long lVar11;
  long lVar12;
  int *piVar13;
  size_t __n;
  int *piVar14;
  ushort local_34;
  
  local_34 = *(ushort *)((long)dxva + 2);
  uVar5 = local_34 & 0x81;
  __n = 0x188;
  if (uVar5 == 1) {
    __n = 0x6a8;
  }
  memcpy((void *)((long)dxva + 0x8c8),buf,__n);
  local_34 = local_34 & 0x81;
  if (uVar5 != 1) {
    memset((void *)((long)dxva + 0xf70),0,0x2d00);
  }
  piVar13 = (int *)((long)buf + __n);
  bVar2 = 1;
  lVar6 = 0;
  do {
    lVar4 = (long)dxva + lVar6 * 0x120 + 0x2a70;
    lVar6 = (long)dxva + lVar6 * 0x1b0 + 0xf70;
    lVar7 = 0;
    do {
      lVar11 = 0;
      bVar3 = true;
      do {
        bVar8 = bVar3;
        lVar9 = lVar11 * 0x240 + lVar4;
        piVar10 = (int *)(lVar11 * 0x360 + lVar6);
        lVar11 = 0;
        do {
          lVar12 = 0;
          piVar14 = piVar10;
          do {
            iVar1 = piVar13[1];
            *(int *)(lVar9 + lVar12 * 8) = iVar1;
            *(int *)(lVar9 + 4 + lVar12 * 8) = *piVar13 - iVar1;
            *piVar14 = piVar13[2];
            piVar14[1] = piVar13[3];
            piVar14[2] = piVar13[4];
            piVar13 = piVar13 + 5;
            lVar12 = lVar12 + 1;
            piVar14 = piVar14 + 3;
          } while (lVar12 != 6);
          lVar11 = lVar11 + 1;
          lVar9 = lVar9 + 0x30;
          piVar10 = piVar10 + 0x12;
        } while (lVar11 != 6);
        lVar11 = 1;
        bVar3 = false;
      } while (bVar8);
      lVar7 = lVar7 + 1;
      lVar4 = lVar4 + 0x480;
      lVar6 = lVar6 + 0x6c0;
    } while (lVar7 != 4);
    lVar6 = 1;
    bVar3 = (bool)(local_34 == 1 & bVar2);
    bVar2 = 0;
  } while (bVar3);
  return;
}

Assistant:

void hal_vp9d_update_counts(void *buf, void *dxva)
{
    DXVA_PicParams_VP9 *s = (DXVA_PicParams_VP9*)dxva;
    RK_S32 i, j, m, n, k;
    RK_U32 *eob_coef;
    RK_S32 ref_type;
#ifdef dump
    RK_U32 count_length;
#endif
    RK_U32 com_len = 0;

#ifdef dump
    if (!(s->frame_type == 0 || s->intra_only)) //inter
        count_length = (213 * 64 + 576 * 5 * 32) / 8;
    else //intra
        count_length = (49 * 64 + 288 * 5 * 32) / 8;

    fwrite(buf, 1, count_length, vp9_fp1);
    fflush(vp9_fp1);
#endif
    if ((s->frame_type == 0 || s->intra_only)) {
        com_len = sizeof(s->counts.partition) + sizeof(s->counts.skip) + sizeof(s->counts.intra)
                  + sizeof(s->counts.tx32p) + sizeof(s->counts.tx16p) + sizeof(s->counts.tx8p);
    } else {
        com_len = sizeof(s->counts) - sizeof(s->counts.coef) - sizeof(s->counts.eob);
    }
    eob_coef = (RK_U32 *)(buf + com_len);
    memcpy(&s->counts, buf, com_len);
    ref_type = (!(s->frame_type == 0 || s->intra_only)) ? 2 : 1;
    if (ref_type == 1) {
        memset(s->counts.eob, 0, sizeof(s->counts.eob));
        memset(s->counts.coef, 0, sizeof(s->counts.coef));
    }
    for (i = 0; i < ref_type; i++) {
        for (j = 0; j < 4; j++) {
            for (m = 0; m < 2; m++) {
                for (n = 0; n < 6; n++) {
                    for (k = 0; k < 6; k++) {
                        s->counts.eob[j][m][i][n][k][0] = eob_coef[1];
                        s->counts.eob[j][m][i][n][k][1] = eob_coef[0] - eob_coef[1]; //ffmpeg need do  branch_ct[UNCONSTRAINED_NODES][2] =  { neob, eob_counts[i][j][k][l] - neob },
                        s->counts.coef[j][m][i][n][k][0] = eob_coef[2];
                        s->counts.coef[j][m][i][n][k][1] = eob_coef[3];
                        s->counts.coef[j][m][i][n][k][2] = eob_coef[4];
                        eob_coef += 5;
                    }
                }
            }
        }
    }
}